

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void deqp::gls::FboUtil::config::glInitFlat(TextureFlat *cfg,GLenum target,Functions *gl)

{
  TransferFormat TVar1;
  int local_3c;
  int local_38;
  GLint level;
  GLint h;
  GLint w;
  TransferFormat format;
  Functions *gl_local;
  GLenum target_local;
  TextureFlat *cfg_local;
  
  TVar1 = transferImageFormat(&(cfg->super_Texture).super_Image.internalFormat);
  level = (cfg->super_Texture).super_Image.width;
  local_38 = (cfg->super_Texture).super_Image.height;
  for (local_3c = 0; local_3c < (cfg->super_Texture).numLevels; local_3c = local_3c + 1) {
    h = TVar1.format;
    w = TVar1.dataType;
    (*gl->texImage2D)(target,local_3c,(cfg->super_Texture).super_Image.internalFormat.format,level,
                      local_38,0,h,w,(void *)0x0);
    level = de::max<int>(1,level / 2);
    local_38 = de::max<int>(1,local_38 / 2);
  }
  return;
}

Assistant:

static void glInitFlat (const TextureFlat& cfg, GLenum target, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage2D(target, level, cfg.internalFormat.format, w, h, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
	}
}